

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Obj_t * Abc_NodeRecognizeMux(Abc_Obj_t *pNode,Abc_Obj_t **ppNodeT,Abc_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t **ppNodeE_local;
  Abc_Obj_t **ppNodeT_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x57c,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)")
    ;
  }
  iVar1 = Abc_NodeIsMuxType(pNode);
  if (iVar1 != 0) {
    pAVar3 = Abc_ObjFanin0(pNode);
    pAVar4 = Abc_ObjFanin1(pNode);
    iVar1 = Abc_ObjFaninId0(pAVar3);
    iVar2 = Abc_ObjFaninId0(pAVar4);
    if (iVar1 == iVar2) {
      iVar1 = Abc_ObjFaninC0(pAVar3);
      iVar2 = Abc_ObjFaninC0(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Abc_ObjFaninC0(pAVar3);
        if (iVar1 != 0) {
          pAVar5 = Abc_ObjChild1(pAVar4);
          pAVar5 = Abc_ObjNot(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Abc_ObjChild1(pAVar3);
          pAVar3 = Abc_ObjNot(pAVar3);
          *ppNodeE = pAVar3;
          pAVar3 = Abc_ObjChild0(pAVar4);
          return pAVar3;
        }
        pAVar5 = Abc_ObjChild1(pAVar3);
        pAVar5 = Abc_ObjNot(pAVar5);
        *ppNodeT = pAVar5;
        pAVar4 = Abc_ObjChild1(pAVar4);
        pAVar4 = Abc_ObjNot(pAVar4);
        *ppNodeE = pAVar4;
        pAVar3 = Abc_ObjChild0(pAVar3);
        return pAVar3;
      }
    }
    iVar1 = Abc_ObjFaninId0(pAVar3);
    iVar2 = Abc_ObjFaninId1(pAVar4);
    if (iVar1 == iVar2) {
      iVar1 = Abc_ObjFaninC0(pAVar3);
      iVar2 = Abc_ObjFaninC1(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Abc_ObjFaninC0(pAVar3);
        if (iVar1 != 0) {
          pAVar5 = Abc_ObjChild0(pAVar4);
          pAVar5 = Abc_ObjNot(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Abc_ObjChild1(pAVar3);
          pAVar3 = Abc_ObjNot(pAVar3);
          *ppNodeE = pAVar3;
          pAVar3 = Abc_ObjChild1(pAVar4);
          return pAVar3;
        }
        pAVar5 = Abc_ObjChild1(pAVar3);
        pAVar5 = Abc_ObjNot(pAVar5);
        *ppNodeT = pAVar5;
        pAVar4 = Abc_ObjChild0(pAVar4);
        pAVar4 = Abc_ObjNot(pAVar4);
        *ppNodeE = pAVar4;
        pAVar3 = Abc_ObjChild0(pAVar3);
        return pAVar3;
      }
    }
    iVar1 = Abc_ObjFaninId1(pAVar3);
    iVar2 = Abc_ObjFaninId0(pAVar4);
    if (iVar1 == iVar2) {
      iVar1 = Abc_ObjFaninC1(pAVar3);
      iVar2 = Abc_ObjFaninC0(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Abc_ObjFaninC1(pAVar3);
        if (iVar1 != 0) {
          pAVar5 = Abc_ObjChild1(pAVar4);
          pAVar5 = Abc_ObjNot(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Abc_ObjChild0(pAVar3);
          pAVar3 = Abc_ObjNot(pAVar3);
          *ppNodeE = pAVar3;
          pAVar3 = Abc_ObjChild0(pAVar4);
          return pAVar3;
        }
        pAVar5 = Abc_ObjChild0(pAVar3);
        pAVar5 = Abc_ObjNot(pAVar5);
        *ppNodeT = pAVar5;
        pAVar4 = Abc_ObjChild1(pAVar4);
        pAVar4 = Abc_ObjNot(pAVar4);
        *ppNodeE = pAVar4;
        pAVar3 = Abc_ObjChild1(pAVar3);
        return pAVar3;
      }
    }
    iVar1 = Abc_ObjFaninId1(pAVar3);
    iVar2 = Abc_ObjFaninId1(pAVar4);
    if (iVar1 == iVar2) {
      iVar1 = Abc_ObjFaninC1(pAVar3);
      iVar2 = Abc_ObjFaninC1(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Abc_ObjFaninC1(pAVar3);
        if (iVar1 == 0) {
          pAVar5 = Abc_ObjChild0(pAVar3);
          pAVar5 = Abc_ObjNot(pAVar5);
          *ppNodeT = pAVar5;
          pAVar4 = Abc_ObjChild0(pAVar4);
          pAVar4 = Abc_ObjNot(pAVar4);
          *ppNodeE = pAVar4;
          pNode_local = Abc_ObjChild1(pAVar3);
        }
        else {
          pAVar5 = Abc_ObjChild0(pAVar4);
          pAVar5 = Abc_ObjNot(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Abc_ObjChild0(pAVar3);
          pAVar3 = Abc_ObjNot(pAVar3);
          *ppNodeE = pAVar3;
          pNode_local = Abc_ObjChild1(pAVar4);
        }
        return pNode_local;
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x5c6,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)")
    ;
  }
  __assert_fail("Abc_NodeIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0x57d,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)");
}

Assistant:

Abc_Obj_t * Abc_NodeRecognizeMux( Abc_Obj_t * pNode, Abc_Obj_t ** ppNodeT, Abc_Obj_t ** ppNodeE )
{
    Abc_Obj_t * pNode0, * pNode1;
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_NodeIsMuxType(pNode) );
    // get children
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    // find the control variable
//    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    if ( Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Abc_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            return Abc_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            return Abc_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    else if ( Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Abc_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            return Abc_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            return Abc_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    else if ( Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Abc_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            return Abc_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            return Abc_ObjChild1(pNode0);//pNode1->p2;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    else if ( Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Abc_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            return Abc_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            return Abc_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}